

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O2

bool __thiscall
google::protobuf::compiler::Parser::ConsumeNumber(Parser *this,double *output,char *error)

{
  TokenType TVar1;
  Tokenizer *pTVar2;
  bool bVar3;
  double dVar4;
  allocator local_41;
  uint64 value;
  string local_38;
  
  pTVar2 = this->input_;
  TVar1 = (pTVar2->current_).type;
  if (TVar1 == TYPE_INTEGER) {
    value = 0;
    bVar3 = io::Tokenizer::ParseInteger(&(pTVar2->current_).text,0xffffffffffffffff,&value);
    if (!bVar3) {
      std::__cxx11::string::string((string *)&local_38,"Integer out of range.",&local_41);
      AddError(this,&local_38);
      std::__cxx11::string::~string((string *)&local_38);
    }
    *output = ((double)CONCAT44(0x45300000,(int)(value >> 0x20)) - 1.9342813113834067e+25) +
              ((double)CONCAT44(0x43300000,(int)value) - 4503599627370496.0);
  }
  else if (TVar1 == TYPE_FLOAT) {
    dVar4 = io::Tokenizer::ParseFloat(&(pTVar2->current_).text);
    *output = dVar4;
  }
  else {
    bVar3 = LookingAt(this,"inf");
    if (bVar3) {
      dVar4 = INFINITY;
    }
    else {
      bVar3 = LookingAt(this,"nan");
      if (!bVar3) {
        std::__cxx11::string::string((string *)&local_38,error,(allocator *)&value);
        AddError(this,&local_38);
        std::__cxx11::string::~string((string *)&local_38);
        return false;
      }
      dVar4 = NAN;
    }
    *output = dVar4;
  }
  io::Tokenizer::Next(this->input_);
  return true;
}

Assistant:

bool Parser::ConsumeNumber(double* output, const char* error) {
  if (LookingAtType(io::Tokenizer::TYPE_FLOAT)) {
    *output = io::Tokenizer::ParseFloat(input_->current().text);
    input_->Next();
    return true;
  } else if (LookingAtType(io::Tokenizer::TYPE_INTEGER)) {
    // Also accept integers.
    uint64 value = 0;
    if (!io::Tokenizer::ParseInteger(input_->current().text, kuint64max,
                                     &value)) {
      AddError("Integer out of range.");
      // We still return true because we did, in fact, parse a number.
    }
    *output = value;
    input_->Next();
    return true;
  } else if (LookingAt("inf")) {
    *output = std::numeric_limits<double>::infinity();
    input_->Next();
    return true;
  } else if (LookingAt("nan")) {
    *output = std::numeric_limits<double>::quiet_NaN();
    input_->Next();
    return true;
  } else {
    AddError(error);
    return false;
  }
}